

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall booster::log::sinks::file::file(file *this,string *file_name,int mf)

{
  pointer pcVar1;
  data *__s;
  int __oflag;
  locale lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_001d0450;
  this->max_files_ = 0;
  this->max_size_ = 0;
  this->current_size_ = 0;
  this->opened_ = false;
  this->append_ = false;
  this->use_local_time_ = true;
  this->tz_offset_ = 0;
  __s = (data *)operator_new(0x210);
  memset(__s,0,0x210);
  std::fstream::fstream(__s);
  (this->d).ptr_ = __s;
  if (mf == -1) {
    this->append_ = true;
  }
  else if ((0 < mf) && (this->opened_ == false)) {
    this->max_files_ = mf;
  }
  std::locale::classic();
  std::ios::imbue(&lStack_58);
  std::locale::~locale(&lStack_58);
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + file_name->_M_string_length);
  open(this,(char *)local_50,__oflag);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

file::file(std::string const &file_name,int mf) :
			max_files_(0),
			max_size_(0),
			current_size_(0),
			opened_(false),
			append_(false),
			use_local_time_(true),
			tz_offset_(0),
			d(new file::data())
		{
			if(mf == app) {
				append();
			}
			else if(mf > 0) {
				max_files(mf);
			}
			d->stream.imbue(std::locale::classic());
			open(file_name);
		}